

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

double __thiscall
phmap::priv::anon_unknown_0::ProbeStats::PercentileRatio(ProbeStats *this,double Percentile)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __nth;
  bool bVar1;
  size_type sVar2;
  iterator __first;
  iterator __last;
  reference pdVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_50;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> mid;
  vector<double,_std::allocator<double>_> r;
  double Percentile_local;
  ProbeStats *this_local;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&mid,&this->single_table_ratios);
  local_48._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)&mid);
  sVar2 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)&mid);
  auVar6._8_4_ = (int)(sVar2 >> 0x20);
  auVar6._0_8_ = sVar2;
  auVar6._12_4_ = 0x45300000;
  dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * Percentile;
  uVar4 = (ulong)dVar5;
  local_40 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator+(&local_48,uVar4 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f
                      );
  local_50._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::end
                 ((vector<double,_std::allocator<double>_> *)&mid);
  bVar1 = __gnu_cxx::operator!=(&local_40,&local_50);
  if (bVar1) {
    __first = std::vector<double,_std::allocator<double>_>::begin
                        ((vector<double,_std::allocator<double>_> *)&mid);
    __nth._M_current = local_40._M_current;
    __last = std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)&mid);
    std::
    nth_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               __first._M_current,__nth,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               __last._M_current);
    pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_40);
    this_local = (ProbeStats *)*pdVar3;
  }
  else {
    this_local = (ProbeStats *)MaxRatio(this);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&mid);
  return (double)this_local;
}

Assistant:

double PercentileRatio(double Percentile = 0.95) const {
    auto r = single_table_ratios;
    auto mid = r.begin() + static_cast<size_t>(r.size() * Percentile);
    if (mid != r.end()) {
      std::nth_element(r.begin(), mid, r.end());
      return *mid;
    } else {
      return MaxRatio();
    }
  }